

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O0

shared_ptr<bytecode::CompiledFile> compile(shared_ptr<ScriptAstNode> *script)

{
  element_type *file;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<ScriptAstNode> *in_RSI;
  shared_ptr<bytecode::CompiledFile> sVar1;
  shared_ptr<ScriptAstNode> local_38;
  undefined1 local_28 [8];
  shared_ptr<compiler::AstCompiler> compiler;
  shared_ptr<ScriptAstNode> *script_local;
  
  std::make_shared<compiler::AstCompiler>();
  file = std::__shared_ptr_access<compiler::AstCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<compiler::AstCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)local_28);
  std::shared_ptr<ScriptAstNode>::shared_ptr(&local_38,in_RSI);
  ::compiler::AstCompiler::compile((AstCompiler *)script,(shared_ptr<ScriptAstNode> *)file);
  std::shared_ptr<ScriptAstNode>::~shared_ptr(&local_38);
  std::shared_ptr<compiler::AstCompiler>::~shared_ptr((shared_ptr<compiler::AstCompiler> *)local_28)
  ;
  sVar1.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)script;
  return (shared_ptr<bytecode::CompiledFile>)
         sVar1.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<bytecode::CompiledFile> compile(std::shared_ptr<ScriptAstNode> script) {
  auto compiler = std::make_shared<compiler::AstCompiler>();
  return compiler->compile(std::move(script));
}